

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::UnCamelCaseEnumShortName
                   (string *__return_storage_ptr__,string *name)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  int local_20;
  char c;
  int i;
  string *name_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_20 = 0; uVar3 = std::__cxx11::string::size(), (ulong)(long)local_20 < uVar3;
      local_20 = local_20 + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)name);
    cVar2 = *pcVar4;
    if ((0 < local_20) && (bVar1 = ascii_isupper(cVar2), bVar1)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'_');
    }
    cVar2 = ascii_toupper(cVar2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string UnCamelCaseEnumShortName(const string& name) {
  string result;
  for (int i = 0; i < name.size(); i++) {
    char c = name[i];
    if (i > 0 && ascii_isupper(c)) {
      result += '_';
    }
    result += ascii_toupper(c);
  }
  return result;
}